

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::api::anon_unknown_0::deviceMemoryProperties2
          (TestStatus *__return_storage_ptr__,anon_unknown_0 *this,Context *context)

{
  PlatformInterface *vkp;
  pointer ppVVar1;
  VkInstance pVVar2;
  TestStatus *pTVar3;
  undefined8 instance;
  int iVar4;
  TestError *this_00;
  ulong uVar5;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> devices;
  VkPhysicalDeviceMemoryProperties2KHR extProperties;
  InstanceDriver vki;
  VkPhysicalDeviceMemoryProperties coreProperties;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> local_610;
  VkAllocationCallbacks *local_5f8;
  DestroyInstanceFunc local_5f0;
  VkInstance local_5e8;
  TestStatus *local_5e0;
  undefined1 local_5d8 [16];
  VkAllocationCallbacks *local_5c8 [65];
  InstanceDriver local_3c0;
  VkPhysicalDeviceMemoryProperties local_238;
  
  vkp = *(PlatformInterface **)(this + 8);
  createInstanceWithExtension((Move<vk::VkInstance_s_*> *)local_5d8,vkp,(char *)context);
  instance = local_5d8._0_8_;
  local_5f0 = (DestroyInstanceFunc)local_5d8._8_8_;
  local_5f8 = local_5c8[0];
  local_5e8 = (VkInstance)local_5d8._0_8_;
  ::vk::InstanceDriver::InstanceDriver(&local_3c0,vkp,(VkInstance)local_5d8._0_8_);
  local_5e0 = __return_storage_ptr__;
  ::vk::enumeratePhysicalDevices(&local_610,&local_3c0.super_InstanceInterface,(VkInstance)instance)
  ;
  if (local_610.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_610.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar5 = 0;
    do {
      ppVVar1 = local_610.
                super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      memset(&local_238,0xcd,0x208);
      memset((VkPhysicalDeviceMemoryProperties2KHR *)local_5d8,0xcd,0x218);
      local_5d8._0_4_ = 0x3b9bb07e;
      local_5d8._8_8_ = (DestroyInstanceFunc)0x0;
      ::vk::InstanceDriver::getPhysicalDeviceMemoryProperties(&local_3c0,ppVVar1[uVar5],&local_238);
      ::vk::InstanceDriver::getPhysicalDeviceMemoryProperties2KHR
                (&local_3c0,
                 local_610.
                 super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar5],
                 (VkPhysicalDeviceMemoryProperties2KHR *)local_5d8);
      if (local_5d8._0_4_ != VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MEMORY_PROPERTIES_2_KHR) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,(char *)0x0,
                   "extProperties.sType == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MEMORY_PROPERTIES_2_KHR"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                   ,0x952);
LAB_00444afe:
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if ((DestroyInstanceFunc)local_5d8._8_8_ != (DestroyInstanceFunc)0x0) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,(char *)0x0,"extProperties.pNext == DE_NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                   ,0x953);
        goto LAB_00444afe;
      }
      iVar4 = bcmp(&local_238,local_5c8,0x208);
      if (iVar4 != 0) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,
                   "Mismatch between properties reported by vkGetPhysicalDeviceMemoryProperties and vkGetPhysicalDeviceMemoryProperties2KHR"
                   ,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiFeatureInfo.cpp"
                   ,0x956);
        goto LAB_00444afe;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)local_610.
                                   super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_610.
                                   super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  local_5d8._0_8_ = (VkInstance_s *)local_5c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5d8,"Querying device memory properties succeeded","");
  pTVar3 = local_5e0;
  local_5e0->m_code = QP_TEST_RESULT_PASS;
  (local_5e0->m_description)._M_dataplus._M_p = (pointer)&(local_5e0->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5e0->m_description,local_5d8._0_8_,
             (DestroyInstanceFunc)(local_5d8._8_8_ + local_5d8._0_8_));
  if ((VkInstance_s *)local_5d8._0_8_ != (VkInstance_s *)local_5c8) {
    operator_delete((void *)local_5d8._0_8_,(ulong)((long)&local_5c8[0]->pUserData + 1));
  }
  pVVar2 = local_5e8;
  if (local_610.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_610.
                    super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_610.
                          super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_610.
                          super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ::vk::InstanceDriver::~InstanceDriver(&local_3c0);
  if (pVVar2 != (VkInstance)0x0) {
    (*local_5f0)(pVVar2,local_5f8);
  }
  return pTVar3;
}

Assistant:

tcu::TestStatus deviceMemoryProperties2 (Context& context)
{
	const PlatformInterface&		vkp			= context.getPlatformInterface();
	const Unique<VkInstance>		instance	(createInstanceWithExtension(vkp, "VK_KHR_get_physical_device_properties2"));
	const InstanceDriver			vki			(vkp, *instance);
	const vector<VkPhysicalDevice>	devices		= enumeratePhysicalDevices(vki, *instance);

	for (size_t deviceNdx = 0; deviceNdx < devices.size(); ++deviceNdx)
	{
		VkPhysicalDeviceMemoryProperties		coreProperties;
		VkPhysicalDeviceMemoryProperties2KHR	extProperties;

		deMemset(&coreProperties, 0xcd, sizeof(VkPhysicalDeviceMemoryProperties));
		deMemset(&extProperties, 0xcd, sizeof(VkPhysicalDeviceMemoryProperties2KHR));

		extProperties.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MEMORY_PROPERTIES_2_KHR;
		extProperties.pNext = DE_NULL;

		vki.getPhysicalDeviceMemoryProperties(devices[deviceNdx], &coreProperties);
		vki.getPhysicalDeviceMemoryProperties2KHR(devices[deviceNdx], &extProperties);

		TCU_CHECK(extProperties.sType == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MEMORY_PROPERTIES_2_KHR);
		TCU_CHECK(extProperties.pNext == DE_NULL);

		if (deMemCmp(&coreProperties, &extProperties.memoryProperties, sizeof(VkPhysicalDeviceMemoryProperties)) != 0)
			TCU_FAIL("Mismatch between properties reported by vkGetPhysicalDeviceMemoryProperties and vkGetPhysicalDeviceMemoryProperties2KHR");
	}

	return tcu::TestStatus::pass("Querying device memory properties succeeded");
}